

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O0

vector<StringPiece,_std::allocator<StringPiece>_> *
SplitStringPiece(vector<StringPiece,_std::allocator<StringPiece>_> *__return_storage_ptr__,
                StringPiece input,char sep)

{
  char *pcVar1;
  const_iterator pcVar2;
  const_iterator __last;
  difference_type dVar3;
  char *pcVar4;
  StringPiece local_68;
  StringPiece local_58;
  char *local_48;
  char *next_pos;
  const_iterator pos;
  undefined1 local_22;
  char local_21;
  undefined1 auStack_20 [7];
  char sep_local;
  StringPiece input_local;
  vector<StringPiece,_std::allocator<StringPiece>_> *elems;
  
  input_local.str_ = (char *)input.len_;
  _auStack_20 = input.str_;
  local_22 = 0;
  local_21 = sep;
  input_local.len_ = (size_t)__return_storage_ptr__;
  std::vector<StringPiece,_std::allocator<StringPiece>_>::vector(__return_storage_ptr__);
  pcVar2 = StringPiece::begin((StringPiece *)auStack_20);
  __last = StringPiece::end((StringPiece *)auStack_20);
  dVar3 = std::count<char_const*,char>(pcVar2,__last,&local_21);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::reserve(__return_storage_ptr__,dVar3 + 1);
  next_pos = StringPiece::begin((StringPiece *)auStack_20);
  while( true ) {
    pcVar1 = next_pos;
    pcVar2 = StringPiece::end((StringPiece *)auStack_20);
    pcVar4 = std::find<char_const*,char>(pcVar1,pcVar2,&local_21);
    local_48 = pcVar4;
    pcVar2 = StringPiece::end((StringPiece *)auStack_20);
    pcVar1 = next_pos;
    if (pcVar4 == pcVar2) break;
    StringPiece::StringPiece(&local_68,next_pos,(long)local_48 - (long)next_pos);
    std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
              (__return_storage_ptr__,&local_68);
    next_pos = local_48 + 1;
  }
  pcVar2 = StringPiece::end((StringPiece *)auStack_20);
  StringPiece::StringPiece(&local_58,pcVar1,(long)pcVar2 - (long)next_pos);
  std::vector<StringPiece,_std::allocator<StringPiece>_>::push_back
            (__return_storage_ptr__,&local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<StringPiece> SplitStringPiece(StringPiece input, char sep) {
  vector<StringPiece> elems;
  elems.reserve(count(input.begin(), input.end(), sep) + 1);

  StringPiece::const_iterator pos = input.begin();

  for (;;) {
    const char* next_pos = find(pos, input.end(), sep);
    if (next_pos == input.end()) {
      elems.push_back(StringPiece(pos, input.end() - pos));
      break;
    }
    elems.push_back(StringPiece(pos, next_pos - pos));
    pos = next_pos + 1;
  }

  return elems;
}